

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O0

int fits_int_to_longlong_inplace(int *intarray,long length,int *status)

{
  void *__ptr;
  long nmax;
  long firstelem;
  long ntodo;
  long ii;
  LONGLONG *aliasarray;
  LONGLONG *longlongarray;
  int *status_local;
  long length_local;
  int *intarray_local;
  
  if (*status < 1) {
    firstelem = 10000;
    if (length < 10000) {
      firstelem = length;
    }
    nmax = length - firstelem;
    __ptr = malloc(firstelem << 3);
    if (__ptr == (void *)0x0) {
      ffpmsg("Out of memory. (fits_int_to_longlong_inplace)");
      *status = 0x71;
      intarray_local._4_4_ = 0x71;
    }
    else {
      while (0 < firstelem) {
        for (ntodo = 0; ntodo < firstelem; ntodo = ntodo + 1) {
          *(long *)((long)__ptr + ntodo * 8) = (long)intarray[ntodo + nmax];
        }
        memcpy(intarray + nmax * 2,__ptr,firstelem << 3);
        if (nmax == 0) {
          firstelem = 0;
        }
        else if (nmax < 0x2711) {
          firstelem = nmax;
          nmax = 0;
        }
        else {
          nmax = nmax + -10000;
        }
      }
      free(__ptr);
      intarray_local._4_4_ = *status;
    }
  }
  else {
    intarray_local._4_4_ = *status;
  }
  return intarray_local._4_4_;
}

Assistant:

static int fits_int_to_longlong_inplace(int *intarray, long length, int *status)

/* convert the input array of 32-bit integers into an array of 64-bit integers,
in place. This will overwrite the input array with the new longer array starting
at the same memory location.  

Note that aliasing the same memory location with pointers of different datatypes is
not allowed in strict ANSI C99, however it is  used here for efficency. In principle,
one could simply copy the input array in reverse order to the output array,
but this only works if the compiler performs the operation in strict order.  Certain
compiler optimization techniques may vioate this assumption.  Therefore, we first
copy a section of the input array to a temporary intermediate array, before copying
the longer datatype values back to the original array.
*/

{
    LONGLONG *longlongarray, *aliasarray;
    long ii, ntodo, firstelem, nmax = 10000;
    
    if (*status > 0) 
        return(*status);

    ntodo = nmax;
    if (length < nmax) ntodo = length;
    
    firstelem = length - ntodo;  /* first element to be converted */
    
    longlongarray = (LONGLONG *) malloc(ntodo * sizeof(LONGLONG));
    
    if (longlongarray == NULL)
    {
	ffpmsg("Out of memory. (fits_int_to_longlong_inplace)");
	return (*status = MEMORY_ALLOCATION);
    }

    aliasarray = (LONGLONG *) intarray; /* alias pointer to the input array */

    while (ntodo > 0) {
    
	/* do datatype conversion into temp array */
        for (ii = 0; ii < ntodo; ii++) { 
	    longlongarray[ii] = intarray[ii + firstelem];
        }

        /* copy temp array back to alias */
        memcpy(&(aliasarray[firstelem]), longlongarray, ntodo * 8);
	
        if (firstelem == 0) {  /* we are all done */
	    ntodo = 0;   
	} else {  /* recalculate ntodo and firstelem for next loop */
	    if (firstelem > nmax) {
	        firstelem -= nmax;
	    } else {
	        ntodo = firstelem;
	        firstelem = 0;
	    }
	}
    }

    free(longlongarray);
    return(*status);
}